

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_frame_header(j_compress_ptr cinfo)

{
  bool bVar1;
  int iVar2;
  jpeg_component_info *local_28;
  jpeg_component_info *compptr;
  int local_18;
  boolean is_baseline;
  int prec;
  int ci;
  j_compress_ptr cinfo_local;
  
  local_18 = 0;
  is_baseline = 0;
  local_28 = cinfo->comp_info;
  for (; is_baseline < cinfo->num_components; is_baseline = is_baseline + 1) {
    iVar2 = emit_dqt(cinfo,local_28->quant_tbl_no);
    local_18 = iVar2 + local_18;
    local_28 = local_28 + 1;
  }
  if ((((cinfo->arith_code == 0) && (cinfo->progressive_mode == 0)) && (cinfo->data_precision == 8))
     && (cinfo->block_size == 8)) {
    bVar1 = true;
    is_baseline = 0;
    local_28 = cinfo->comp_info;
    for (; is_baseline < cinfo->num_components; is_baseline = is_baseline + 1) {
      if ((1 < local_28->dc_tbl_no) || (1 < local_28->ac_tbl_no)) {
        bVar1 = false;
      }
      local_28 = local_28 + 1;
    }
    if ((local_18 != 0) && (bVar1)) {
      bVar1 = false;
      cinfo->err->msg_code = 0x4d;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,0);
    }
  }
  else {
    bVar1 = false;
  }
  if (cinfo->arith_code == 0) {
    if (cinfo->progressive_mode == 0) {
      if (bVar1) {
        emit_sof(cinfo,M_SOF0);
      }
      else {
        emit_sof(cinfo,M_SOF1);
      }
    }
    else {
      emit_sof(cinfo,M_SOF2);
    }
  }
  else if (cinfo->progressive_mode == 0) {
    emit_sof(cinfo,M_SOF9);
  }
  else {
    emit_sof(cinfo,M_SOF10);
  }
  if ((cinfo->progressive_mode != 0) && (cinfo->block_size != 8)) {
    emit_pseudo_sos(cinfo);
  }
  return;
}

Assistant:

METHODDEF(void)
write_frame_header (j_compress_ptr cinfo)
{
  int ci, prec;
  boolean is_baseline;
  jpeg_component_info *compptr;
  
  /* Emit DQT for each quantization table.
   * Note that emit_dqt() suppresses any duplicate tables.
   */
  prec = 0;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    prec += emit_dqt(cinfo, compptr->quant_tbl_no);
  }
  /* now prec is nonzero iff there are any 16-bit quant tables. */

  /* Check for a non-baseline specification.
   * Note we assume that Huffman table numbers won't be changed later.
   */
  if (cinfo->arith_code || cinfo->progressive_mode ||
      cinfo->data_precision != 8 || cinfo->block_size != DCTSIZE) {
    is_baseline = FALSE;
  } else {
    is_baseline = TRUE;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      if (compptr->dc_tbl_no > 1 || compptr->ac_tbl_no > 1)
	is_baseline = FALSE;
    }
    if (prec && is_baseline) {
      is_baseline = FALSE;
      /* If it's baseline except for quantizer size, warn the user */
      TRACEMS(cinfo, 0, JTRC_16BIT_TABLES);
    }
  }

  /* Emit the proper SOF marker */
  if (cinfo->arith_code) {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF10); /* SOF code for progressive arithmetic */
    else
      emit_sof(cinfo, M_SOF9);  /* SOF code for sequential arithmetic */
  } else {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF2);	/* SOF code for progressive Huffman */
    else if (is_baseline)
      emit_sof(cinfo, M_SOF0);	/* SOF code for baseline implementation */
    else
      emit_sof(cinfo, M_SOF1);	/* SOF code for non-baseline Huffman file */
  }

  /* Check to emit pseudo SOS marker */
  if (cinfo->progressive_mode && cinfo->block_size != DCTSIZE)
    emit_pseudo_sos(cinfo);
}